

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_multipivot.cpp
# Opt level: O1

void multikey_multipivot<unsigned_int,32u>(uchar **strings,size_t n,size_t depth)

{
  _Rb_tree_header *__position;
  uchar *puVar1;
  size_t n_00;
  size_t n_01;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  size_t i_2;
  void *__src;
  uint j;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uchar **ppuVar15;
  unsigned_long uVar16;
  byte bVar17;
  uint j_1;
  long lVar18;
  void **__memptr;
  byte *__ptr;
  int iVar19;
  size_t n_02;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sample_array;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> sample;
  array<unsigned_int,_32UL> pivots;
  array<unsigned_long,_65UL> bucketsize;
  byte local_338;
  byte bStack_334;
  byte bStack_330;
  byte bStack_32c;
  void *local_320;
  long local_318;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_308;
  double local_2d8;
  double dStack_2d0;
  uint local_2c8 [3];
  uint uStack_2bc;
  _Alloc_node local_2b8 [15];
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  uint auStack_220 [120];
  size_t local_40;
  size_t local_38;
  
  if (n < 15000) {
    mkqsort(strings,(int)n,(int)depth);
    return;
  }
  __position = &local_308._M_impl.super__Rb_tree_header;
  local_308._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  iVar19 = 0;
  local_308._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_308._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar11 = n - 7;
  auVar22._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar22._0_8_ = lVar11;
  auVar22._12_4_ = 0x45300000;
  dStack_2d0 = auVar22._8_8_ - 1.9342813113834067e+25;
  local_2d8 = dStack_2d0 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  local_308._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_308._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    dVar21 = drand48();
    uVar10 = (ulong)(dVar21 * local_2d8);
    uVar10 = (long)(dVar21 * local_2d8 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    if (n <= uVar10 + 6) {
      __assert_fail("pos+6 < n",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                    ,0x180,
                    "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned int, Pivots = 32U]"
                   );
    }
    lVar11 = 0;
    do {
      puVar1 = strings[uVar10 + lVar11];
      if (puVar1 == (uchar *)0x0) goto LAB_002231a8;
      if (puVar1[depth] == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (uint)puVar1[depth] << 0x18;
        if (puVar1[depth + 1] != 0) {
          uVar13 = uVar13 | (uint)puVar1[depth + 1] << 0x10;
          if (puVar1[depth + 2] != '\0') {
            uVar13 = uVar13 | CONCAT11(puVar1[depth + 2],puVar1[depth + 3]);
          }
        }
      }
      *(uint *)((long)&local_238 + lVar11 * 4) = uVar13;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 7);
    lVar11 = 0;
    local_2b8[0]._M_t = &local_308;
    do {
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::
      _M_insert_unique_<unsigned_int&,std::_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>::_Alloc_node>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_308,(const_iterator)__position,(uint *)((long)&local_238 + lVar11),
                 local_2b8);
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x1c);
    iVar19 = iVar19 + 1;
  } while (iVar19 != 0x20);
  local_238._0_4_ = 1;
  if (local_308._M_impl.super__Rb_tree_header._M_node_count < 0x20) {
    do {
      if ((char)(uint)local_238 == '\0') {
        local_238._0_4_ = (uint)local_238 | 1;
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_308,(uint *)&local_238);
      local_238._0_4_ = (uint)local_238 + 1;
    } while (local_308._M_impl.super__Rb_tree_header._M_node_count < 0x20);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_320,
             (_Rb_tree_const_iterator<unsigned_int>)
             local_308._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_int>)__position,(allocator_type *)&local_238);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&local_308);
  uVar10 = (ulong)(local_318 - (long)local_320) >> 7;
  if ((int)uVar10 == 0) {
    __assert_fail("step > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                  ,0x191,
                  "void multikey_multipivot(unsigned char **, size_t, size_t) [CharT = unsigned int, Pivots = 32U]"
                 );
  }
  uVar14 = 0;
  lVar11 = 0;
  do {
    *(undefined4 *)((long)&local_2b8[0]._M_t + lVar11 * 4) =
         *(undefined4 *)((long)local_320 + (uVar14 & 0xffffffff) * 4);
    lVar11 = lVar11 + 1;
    uVar14 = uVar14 + uVar10;
  } while (lVar11 != 0x20);
  __memptr = (void **)&local_238;
  iVar19 = posix_memalign(__memptr,0x10,n);
  pbVar6 = (byte *)CONCAT44(local_238._4_4_,(uint)local_238);
  lVar11 = 0;
  do {
    uVar13 = *(uint *)((long)&local_2b8[0]._M_t + lVar11 * 4);
    lVar18 = 0;
    do {
      *(uint *)((long)__memptr + lVar18 * 4) = uVar13 ^ 0x80000000;
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    lVar11 = lVar11 + 1;
    __memptr = __memptr + 2;
  } while (lVar11 != 0x20);
  __ptr = (byte *)0x0;
  if (iVar19 == 0) {
    __ptr = pbVar6;
  }
  uVar10 = n & 0xfffffffffffffff0;
  if (uVar10 != 0) {
    uVar14 = 0;
    ppuVar15 = strings;
    do {
      lVar11 = 0;
      do {
        puVar1 = ppuVar15[lVar11];
        if (puVar1 == (uchar *)0x0) goto LAB_002231a8;
        if (puVar1[depth] == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = (uint)puVar1[depth] << 0x18;
          if (puVar1[depth + 1] != 0) {
            uVar13 = uVar13 | (uint)puVar1[depth + 1] << 0x10;
            if (puVar1[depth + 2] != '\0') {
              uVar13 = uVar13 | CONCAT11(puVar1[depth + 2],puVar1[depth + 3]);
            }
          }
        }
        local_2c8[lVar11] = uVar13;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      uVar23 = local_2c8[0] ^ 0x80000000;
      uVar24 = local_2c8[1] ^ 0x80000000;
      uVar25 = local_2c8[2] ^ 0x80000000;
      uVar26 = uStack_2bc ^ 0x80000000;
      local_338 = 0;
      bStack_334 = 0;
      bStack_330 = 0;
      bStack_32c = 0;
      lVar11 = 0x10;
      uVar13 = (uint)local_238;
      uVar31 = local_238._4_4_;
      uVar32 = (uint)uStack_230;
      uVar33 = uStack_230._4_4_;
      bVar17 = 1;
      bVar7 = 1;
      bVar8 = 1;
      bVar9 = 1;
      do {
        bVar30 = bVar9;
        bVar29 = bVar8;
        bVar28 = bVar7;
        bVar27 = bVar17;
        uVar2 = *(uint *)((long)&local_238 + lVar11);
        uVar3 = *(uint *)((long)&local_238 + lVar11 + 4);
        uVar4 = *(uint *)((long)&uStack_230 + lVar11);
        uVar5 = *(uint *)((long)&uStack_230 + lVar11 + 4);
        local_338 = -((int)uVar23 < (int)uVar2) & -((int)uVar13 < (int)uVar23) & bVar27 + 1 |
                    -(uVar23 == uVar13) & bVar27 | local_338;
        bStack_334 = -((int)uVar24 < (int)uVar3) & -((int)uVar31 < (int)uVar24) & bVar28 + 1 |
                     -(uVar24 == uVar31) & bVar28 | bStack_334;
        bStack_330 = -((int)uVar25 < (int)uVar4) & -((int)uVar32 < (int)uVar25) & bVar29 + 1 |
                     -(uVar25 == uVar32) & bVar29 | bStack_330;
        bStack_32c = -((int)uVar26 < (int)uVar5) & -((int)uVar33 < (int)uVar26) & bVar30 + 1 |
                     -(uVar26 == uVar33) & bVar30 | bStack_32c;
        lVar11 = lVar11 + 0x10;
        uVar13 = uVar2;
        uVar31 = uVar3;
        uVar32 = uVar4;
        uVar33 = uVar5;
        bVar17 = bVar27 + 2;
        bVar7 = bVar28 + 2;
        bVar8 = bVar29 + 2;
        bVar9 = bVar30 + 2;
      } while (lVar11 != 0x200);
      local_338 = local_338 |
                  -((int)uVar2 < (int)uVar23) & bVar27 + 3 | -(uVar23 == uVar2) & bVar27 + 2;
      bStack_334 = bStack_334 |
                   -((int)uVar3 < (int)uVar24) & bVar28 + 3 | -(uVar24 == uVar3) & bVar28 + 2;
      bStack_330 = bStack_330 |
                   -((int)uVar4 < (int)uVar25) & bVar29 + 3 | -(uVar25 == uVar4) & bVar29 + 2;
      bStack_32c = bStack_32c |
                   -((int)uVar5 < (int)uVar26) & bVar30 + 3 | -(uVar26 == uVar5) & bVar30 + 2;
      __ptr[uVar14] = local_338;
      __ptr[uVar14 + 1] = bStack_334;
      __ptr[uVar14 + 2] = bStack_330;
      __ptr[uVar14 + 3] = bStack_32c;
      uVar14 = uVar14 + 4;
      ppuVar15 = ppuVar15 + 4;
    } while (uVar14 < uVar10);
  }
  if (uVar10 != n) {
    do {
      puVar1 = strings[uVar10];
      if (puVar1 == (uchar *)0x0) {
LAB_002231a8:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      bVar17 = puVar1[depth];
      if (bVar17 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = (uint)bVar17 << 0x18;
        if (puVar1[depth + 1] != 0) {
          uVar13 = (uint)bVar17 << 0x18 | (uint)puVar1[depth + 1] << 0x10;
          if (puVar1[depth + 2] != '\0') {
            uVar13 = uVar13 | CONCAT11(puVar1[depth + 2],puVar1[depth + 3]);
          }
        }
      }
      if (uVar13 < (uint)local_2b8[0]._M_t) {
        __ptr[uVar10] = 0;
      }
      else {
        bVar17 = 2;
        uVar14 = 0;
        bVar20 = false;
        do {
          uVar31 = *(uint *)((long)&local_2b8[0]._M_t + uVar14 * 4);
          if (uVar13 == uVar31) {
            bVar17 = bVar17 - 1;
LAB_00222f01:
            __ptr[uVar10] = bVar17;
            if (!bVar20) goto LAB_00222f1b;
            break;
          }
          if ((uVar31 < uVar13) && (uVar13 < *(uint *)((long)&local_2b8[0]._M_t + uVar14 * 4 + 4)))
          goto LAB_00222f01;
          bVar20 = 0x1d < uVar14;
          uVar14 = uVar14 + 1;
          bVar17 = bVar17 + 2;
        } while (uVar14 != 0x1f);
        if (uVar13 == uStack_240._4_4_) {
          __ptr[uVar10] = 0x3f;
        }
        else {
          __ptr[uVar10] = 0x40;
        }
      }
LAB_00222f1b:
      uVar10 = uVar10 + 1;
    } while (uVar10 < n);
  }
  memset(&local_238,0,0x208);
  uVar14 = (ulong)*__ptr;
  (&local_238)[uVar14] = (&local_238)[uVar14] + 1;
  uVar10 = 2;
  if (2 < n) {
    uVar10 = n;
  }
  bVar20 = true;
  uVar12 = 1;
  do {
    bVar17 = __ptr[uVar12];
    if (bVar17 < (byte)uVar14) {
      bVar20 = false;
      break;
    }
    (&local_238)[bVar17] = (&local_238)[bVar17] + 1;
    uVar14 = (ulong)bVar17;
    uVar12 = uVar12 + 1;
  } while (uVar10 != uVar12);
  if (uVar12 < n) {
    do {
      (&local_238)[__ptr[uVar12]] = (&local_238)[__ptr[uVar12]] + 1;
      uVar12 = uVar12 + 1;
    } while (n != uVar12);
  }
  if (!bVar20) {
    __src = malloc(n * 8);
    multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[0] = 0;
    lVar11 = 0;
    uVar16 = 0;
    do {
      uVar16 = uVar16 + (&local_238)[lVar11];
      multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[lVar11 + 1] = uVar16;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x40);
    lVar11 = 0;
    do {
      puVar1 = strings[lVar11];
      uVar16 = multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[__ptr[lVar11]];
      multikey_multipivot<unsigned_int,_32U>::bucketindex._M_elems[__ptr[lVar11]] = uVar16 + 1;
      *(uchar **)((long)__src + uVar16 * 8) = puVar1;
      lVar11 = lVar11 + 1;
    } while (n + (n == 0) != lVar11);
    memcpy(strings,__src,n * 8);
    free(__src);
  }
  free(__ptr);
  n_02 = CONCAT44(local_238._4_4_,(uint)local_238);
  if (n_02 != 0) {
    multikey_multipivot<unsigned_int,32u>(strings,n_02,depth);
  }
  lVar11 = 4;
  do {
    n_00 = *(size_t *)((long)&uStack_240 + lVar11 * 4);
    if ((n_00 != 0) && (*(char *)((long)&uStack_2bc + lVar11) != '\0')) {
      multikey_multipivot<unsigned_int,32u>(strings + n_02,n_00,depth + 4);
    }
    n_01 = *(size_t *)((long)&local_238 + lVar11 * 4);
    if (n_01 != 0) {
      uVar13 = *(uint *)((long)&uStack_2bc + lVar11);
      uVar31 = *(uint *)((long)&local_2b8[0]._M_t + lVar11);
      if (uVar13 == uVar31) {
        __assert_fail("a != b",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_multipivot.cpp"
                      ,0x60,"unsigned int lcp(uint32_t, uint32_t)");
      }
      if ((uVar13 & 0xff000000) == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        if ((uVar13 & 0xff000000) == (uVar31 & 0xff000000)) {
          uVar10 = 1;
          if (((uVar13 & 0xff0000) != 0) && ((uVar13 & 0xff0000) == (uVar31 & 0xff0000))) {
            uVar10 = (ulong)((uVar13 & 0xff00) == (uVar31 & 0xff00) && (uVar13 & 0xff00) != 0) | 2;
          }
        }
      }
      multikey_multipivot<unsigned_int,32u>(strings + n_00 + n_02,n_01,uVar10 + depth);
    }
    n_02 = n_01 + n_00 + n_02;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x80);
  if (local_40 != 0) {
    if (uStack_240._4_1_ != '\0') {
      multikey_multipivot<unsigned_int,32u>(strings + n_02,local_40,depth + 4);
    }
    n_02 = n_02 + local_40;
  }
  if (local_38 != 0) {
    multikey_multipivot<unsigned_int,32u>(strings + n_02,local_38,depth);
  }
  if (local_320 != (void *)0x0) {
    operator_delete(local_320);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_308);
  return;
}

Assistant:

static void
multikey_multipivot(unsigned char** strings, size_t n, size_t depth)
{
	static_assert(Pivots > 0, "Pivots must be non-zero");
	static_assert(total_buckets(Pivots) < 0x100, "total number of bucket must be max 255");
	if (n < 15000) {
		mkqsort(strings, n, depth);
		return;
	}
	// TODO: collect frequencies to gain knowledge about distribution
	std::set<CharT> sample;
	for (unsigned i=0; i < Pivots; ++i) {
		double r=drand48();
		size_t pos = ((size_t)((n-7)*r));
		assert(pos+6 < n);
		std::array<CharT, 7> tmp;
		for (unsigned j=0;j<tmp.size();++j) {
			tmp[j] = get_char<CharT>(strings[pos+j], depth);
		}
		sample.insert(tmp.begin(), tmp.end());
	}
	// We _must_ select enough pivots -> insert junk.
	for (CharT i=1; sample.size() < Pivots; ++i) {
		if (is_end(i)) ++i;
		sample.insert(i);
	}
	// Pick pivots from the sample.
	std::vector<CharT> sample_array(sample.begin(), sample.end());
	sample.clear();
	std::array<CharT, Pivots> pivots;
	unsigned step = sample_array.size() / Pivots;
	assert(step > 0);
	for (unsigned i=0; i < Pivots; ++i) {
		pivots[i] = sample_array[step*i];
	}
	uint8_t* restrict oracle = static_cast<uint8_t*>(_mm_malloc(n, 16));
	fill_oracle<Pivots>(strings, n, oracle, pivots, depth);
	std::array<size_t, total_buckets(Pivots)> bucketsize;
	bucketsize.fill(0);
	uint8_t prev = oracle[0];
	bool sorted = true;
	size_t i=1;
	++bucketsize[prev];
	for (; i < n; ++i) {
		uint8_t bucket = oracle[i];
		if (prev > bucket) {
			sorted = false; break;
		}
		++bucketsize[bucket];
		prev = bucket;
	}
	for (; i < n; ++i)
		++bucketsize[oracle[i]];
	if (not sorted) {
		unsigned char** sorted = (unsigned char**)
			malloc(n*sizeof(unsigned char*));
		static std::array<size_t, total_buckets(Pivots)> bucketindex;
		bucketindex[0] = 0;
		for (unsigned i=1; i < total_buckets(Pivots); ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < n; ++i)
			sorted[bucketindex[oracle[i]]++] = strings[i];
		memcpy(strings, sorted, n*sizeof(unsigned char*));
		free(sorted);
	}
	_mm_free(oracle);
	size_t b=0;
	size_t bsum = bucketsize[0];
	if (bsum) multikey_multipivot<CharT, Pivots>(strings, bsum, depth);
	for (unsigned i=0; i < Pivots-1; ++i) {
		b = bucketsize[middle_bucket(i)];
		if (b and not is_end(pivots[i])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
					depth+sizeof(CharT));
		}
		bsum += b;
		if ((b = bucketsize[right_bucket(i)])) {
			multikey_multipivot<CharT, Pivots>(strings+bsum, b,
				depth+lcp(pivots[i], pivots[i+1]));
		}
		bsum += b;
	}
	if ((b = bucketsize[middle_bucket(Pivots-1)])) {
		if (not is_end(pivots[Pivots-1]))
			multikey_multipivot<CharT, Pivots>(strings+bsum,
				b, depth+sizeof(CharT));
		bsum += b;
	}
	if ((b = bucketsize[right_bucket(Pivots-1)])) {
		multikey_multipivot<CharT, Pivots>(strings+bsum, b, depth);
	}
}